

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

void __thiscall
rsg::DeclarationStatement::execute(DeclarationStatement *this,ExecutionContext *execCtx)

{
  int iVar1;
  undefined4 extraout_var;
  ConstStridedValueAccess<64> local_48;
  ConstStridedValueAccess<64> local_38;
  StridedValueRead<64> local_28;
  ExecutionContext *local_18;
  ExecutionContext *execCtx_local;
  DeclarationStatement *this_local;
  
  if (this->m_expression != (Expression *)0x0) {
    local_18 = execCtx;
    execCtx_local = (ExecutionContext *)this;
    (*this->m_expression->_vptr_Expression[4])(this->m_expression,execCtx);
    iVar1 = (*this->m_expression->_vptr_Expression[5])();
    local_38.m_type = (VariableType *)CONCAT44(extraout_var,iVar1);
    local_28 = ConstStridedValueAccess<64>::value(&local_38);
    local_48 = (ConstStridedValueAccess<64>)ExecutionContext::getValue(local_18,this->m_variable);
    StridedValueAccess<64>::operator=((StridedValueAccess<64> *)&local_48,&local_28);
  }
  return;
}

Assistant:

void DeclarationStatement::execute (ExecutionContext& execCtx) const
{
	if (m_expression)
	{
		m_expression->evaluate(execCtx);
		execCtx.getValue(m_variable) = m_expression->getValue().value();
	}
}